

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O0

VRMatrix4 * __thiscall MinVR::VRMatrix4::cofactor(VRMatrix4 *this)

{
  float *pfVar1;
  VRMatrix4 *in_RDI;
  float fVar2;
  int in_stack_00000018;
  int in_stack_0000001c;
  VRMatrix4 *in_stack_00000020;
  float det;
  int c;
  int r;
  int i;
  VRMatrix4 *out;
  VRMatrix4 *this_00;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  
  this_00 = in_RDI;
  VRMatrix4(in_RDI);
  local_18 = 1;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
      fVar2 = subDeterminant(in_stack_00000020,in_stack_0000001c,in_stack_00000018);
      pfVar1 = operator()(this_00,local_1c,local_20);
      *pfVar1 = (float)local_18 * fVar2;
      local_18 = -local_18;
    }
    local_18 = -local_18;
  }
  return in_RDI;
}

Assistant:

VRMatrix4 VRMatrix4::cofactor() const {
  VRMatrix4 out;
  // We'll use i to incrementally compute -1^(r+c)
  int i = 1;
  for (int r = 0; r < 4; ++r) {
    for (int c = 0; c < 4; ++c) {
      // Compute the determinant of the 3x3 submatrix
      float det = subDeterminant(r, c);
      out(r,c) = i * det;
      i = -i;
    }
    i = -i;
  }
  return out;
}